

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  World *this;
  bool bVar1;
  int iVar2;
  time_t tVar3;
  GLFWwindow *handle;
  GLFWwindow *ctx;
  double dVar4;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    fprintf(_stderr,"Failed to initialize GLFW\n");
    exit(1);
  }
  handle = glfwCreateWindow(0x294,0x294,"lanaTetris",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  glfwWindowHint(0x20003,0);
  if (handle != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(handle);
    reshape(handle,0x294,0x294);
    init((EVP_PKEY_CTX *)(ulong)(uint)argc);
    glfwSetWindowSizeCallback(handle,reshape);
    glfwSetKeyCallback(handle,key);
    while (ctx = handle, iVar2 = glfwWindowShouldClose(handle), iVar2 == 0) {
      draw();
      this = world;
      if (state == PLAYING) {
        dVar4 = glfwGetTime();
        bVar1 = World::tick(this,(float)dVar4);
        if (!bVar1) {
          state = MENU;
        }
      }
      glfwSwapBuffers(handle);
      glfwPollEvents();
    }
    cleanup((EVP_PKEY_CTX *)ctx);
    glfwTerminate();
    exit(0);
  }
  fprintf(_stderr,"Failed to open GLFW window\n");
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
    srand((int) time(0));

    GLFWwindow* window;

    if(!glfwInit()) {
        fprintf(stderr, "Failed to initialize GLFW\n" );
        exit(EXIT_FAILURE );
    }
    
    window = glfwCreateWindow(width, height, "lanaTetris", nullptr, nullptr);
    
    glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
    if(!window) {
        fprintf(stderr, "Failed to open GLFW window\n" );
        glfwTerminate();
        exit(EXIT_FAILURE );
    }
    
    glfwMakeContextCurrent(window);
    reshape(window, width, height);
    
    init(argc, argv);
    
    glfwSetWindowSizeCallback(window, reshape);
    glfwSetKeyCallback(window, key);
    
    while (!glfwWindowShouldClose(window)) {
        draw();
        if (state == PLAYING) {
            if (!world->tick(glfwGetTime())) state = MENU;
        }
        
        glfwSwapBuffers(window);
        glfwPollEvents();
    }
    
    cleanup();
    
    glfwTerminate();
    
    exit(EXIT_SUCCESS);
}